

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_libapi.cpp
# Opt level: O1

ze_result_t
zetMetricTracerDecodeExp
          (zet_metric_decoder_exp_handle_t phMetricDecoder,size_t *pRawDataSize,uint8_t *pRawData,
          uint32_t metricsCount,zet_metric_handle_t *phMetrics,uint32_t *pSetCount,
          uint32_t *pMetricEntriesCountPerSet,uint32_t *pMetricEntriesCount,
          zet_metric_entry_exp_t *pMetricEntries)

{
  code *UNRECOVERED_JUMPTABLE;
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (ze_lib::destruction == '\0') {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)(ze_lib::context + 0x18) + 0x48);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      zVar1 = (*UNRECOVERED_JUMPTABLE)();
      return zVar1;
    }
    zVar1 = (uint)*(byte *)(ze_lib::context + 0xd90) * 2 + ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return zVar1;
}

Assistant:

ze_result_t ZE_APICALL
zetMetricTracerDecodeExp(
    zet_metric_decoder_exp_handle_t phMetricDecoder,///< [in] handle of the metric decoder object
    size_t* pRawDataSize,                           ///< [in,out] size in bytes of raw data buffer. If pMetricEntriesCount is
                                                    ///< greater than zero but less than total number of 
                                                    ///< decodable metrics available in the raw data buffer, then driver shall
                                                    ///< update this value with actual number of raw 
                                                    ///< data bytes processed.
    uint8_t* pRawData,                              ///< [in,out][optional][range(0, *pRawDataSize)] buffer containing tracer
                                                    ///< data in raw format
    uint32_t metricsCount,                          ///< [in] number of decodable metrics in the tracer for which the
                                                    ///< hMetricDecoder handle was provided. See 
                                                    ///< ::zetMetricDecoderGetDecodableMetricsExp(). If metricCount is greater
                                                    ///< than zero but less than the number decodable 
                                                    ///< metrics available in the raw data buffer, then driver shall only
                                                    ///< decode those.
    zet_metric_handle_t* phMetrics,                 ///< [in] [range(0, metricsCount)] array of handles of decodable metrics in
                                                    ///< the decoder for which the hMetricDecoder handle was 
                                                    ///< provided. Metrics handles are expected to be for decodable metrics,
                                                    ///< see ::zetMetricDecoderGetDecodableMetricsExp() 
    uint32_t* pSetCount,                            ///< [in,out] pointer to number of metric sets. If count is zero, then the
                                                    ///< driver shall update the value with the total
                                                    ///< number of metric sets to be decoded. If count is greater than the
                                                    ///< number available in the raw data buffer, then the
                                                    ///< driver shall update the value with the actual number of metric sets to
                                                    ///< be decoded. There is a 1:1 relation between
                                                    ///< the number of sets and sub-devices returned in the decoded entries.
    uint32_t* pMetricEntriesCountPerSet,            ///< [in,out][optional][range(0, *pSetCount)] buffer of metric entries
                                                    ///< counts per metric set, one value per set.
    uint32_t* pMetricEntriesCount,                  ///< [in,out]  pointer to the total number of metric entries decoded, for
                                                    ///< all metric sets. If count is zero, then the
                                                    ///< driver shall update the value with the total number of metric entries
                                                    ///< to be decoded. If count is greater than zero
                                                    ///< but less than the total number of metric entries available in the raw
                                                    ///< data, then user provided number will be decoded.
                                                    ///< If count is greater than the number available in the raw data buffer,
                                                    ///< then the driver shall update the value with
                                                    ///< the actual number of decodable metric entries decoded. If set to null,
                                                    ///< then driver will only update the value of
                                                    ///< pSetCount.
    zet_metric_entry_exp_t* pMetricEntries          ///< [in,out][optional][range(0, *pMetricEntriesCount)] buffer containing
                                                    ///< decoded metric entries
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zet_pfnMetricTracerDecodeExp_t pfnDecodeExp = [&result] {
        auto pfnDecodeExp = ze_lib::context->zetDdiTable.load()->MetricTracerExp.pfnDecodeExp;
        if( nullptr == pfnDecodeExp ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnDecodeExp;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnDecodeExp( phMetricDecoder, pRawDataSize, pRawData, metricsCount, phMetrics, pSetCount, pMetricEntriesCountPerSet, pMetricEntriesCount, pMetricEntries );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnDecodeExp = ze_lib::context->zetDdiTable.load()->MetricTracerExp.pfnDecodeExp;
    if( nullptr == pfnDecodeExp ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnDecodeExp( phMetricDecoder, pRawDataSize, pRawData, metricsCount, phMetrics, pSetCount, pMetricEntriesCountPerSet, pMetricEntriesCount, pMetricEntries );
    #endif
}